

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O3

void Abc_EnumPrint_rec(Vec_Int_t *vGates,int i,int nVars)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  if (-1 < i) {
    uVar3 = i * 2;
    uVar1 = vGates->nSize;
    if ((uVar1 != uVar3 && SBORROW4(uVar1,uVar3) == (int)(uVar1 + i * -2) < 0) &&
       ((uVar3 | 1) < uVar1)) {
      iVar2 = vGates->pArray[uVar3];
      iVar5 = vGates->pArray[uVar3 | 1];
      pcVar6 = "+";
      if (iVar2 < iVar5) {
        pcVar6 = "";
      }
      iVar4 = iVar5;
      if (iVar5 < iVar2) {
        iVar4 = iVar2;
      }
      if (iVar2 < iVar5) {
        iVar5 = iVar2;
      }
      if (iVar5 < nVars) {
        iVar5 = iVar5 + 0x61;
      }
      else {
        putchar(0x28);
        Abc_EnumPrint_rec(vGates,iVar5,nVars);
        iVar5 = 0x29;
      }
      putchar(iVar5);
      printf("%s",pcVar6);
      if (iVar4 < nVars) {
        iVar4 = iVar4 + 0x61;
      }
      else {
        putchar(0x28);
        Abc_EnumPrint_rec(vGates,iVar4,nVars);
        iVar4 = 0x29;
      }
      putchar(iVar4);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_EnumPrint_rec( Vec_Int_t * vGates, int i, int nVars )
{
    int Fan0 = Vec_IntEntry(vGates, 2*i);
    int Fan1 = Vec_IntEntry(vGates, 2*i+1);
    char * pOper = (char*)(Fan0 < Fan1 ? "" : "+");
    if ( Fan0 > Fan1 )
        ABC_SWAP( int, Fan0, Fan1 );
    if ( Fan0 < nVars )
        printf( "%c", 'a'+Fan0 );
    else
    {
        printf( "(" );
        Abc_EnumPrint_rec( vGates, Fan0, nVars );
        printf( ")" );
    }
    printf( "%s", pOper );
    if ( Fan1 < nVars )
        printf( "%c", 'a'+Fan1 );
    else
    {
        printf( "(" );
        Abc_EnumPrint_rec( vGates, Fan1, nVars );
        printf( ")" );
    }
}